

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_warning.c
# Opt level: O2

void l2_parsing_warning(l2_parsing_warning_type warning_type,int lines,int cols,...)

{
  undefined8 in_R9;
  va_list va;
  undefined8 local_a0;
  
  if (warning_type == L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE) {
    fprintf(_stderr,anon_var_dwarf_30de,lines,(ulong)(uint)cols,local_a0,in_R9,0x3000000020,
            &stack0x00000008);
  }
  else {
    fwrite(anon_var_dwarf_30fc,0x30,1,_stderr);
  }
  return;
}

Assistant:

void l2_parsing_warning(l2_parsing_warning_type warning_type, int lines, int cols, ...) {
    va_list va;
    va_start(va, cols);

    char *escape_seq;

    switch (warning_type) {
        case L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE:
            escape_seq = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释警告 (在 %d 行 %d 列附近): 未知的转义序列 \'\\%s\', 它将被解释器当做普通字符\n", lines, cols, escape_seq);
            break;

        default:
            fprintf(stderr, "L2 脚本解释警告, 出现一个未知警告\n");
    }

    va_end(va);
}